

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O0

void __thiscall
QuantLib::EndCriteria::EndCriteria
          (EndCriteria *this,size_t maxIterations,size_t maxStationaryStateIterations,
          RealType rootEpsilon,RealType functionEpsilon,RealType gradientNormEpsilon)

{
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  ulong in_XMM0_Qa;
  ulong in_XMM1_Qa;
  ulong in_XMM2_Qa;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_XMM0_Qa;
  in_RDI[3] = in_XMM1_Qa;
  in_RDI[4] = in_XMM2_Qa;
  if (in_RDI[1] < 2) {
    snprintf(painCave.errMsg,2000,"maxStationaryStateIterations_ ( %lu ) must be greater than one\n"
             ,in_RDI[1]);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if (*in_RDI < in_RDI[1]) {
    snprintf(painCave.errMsg,2000,
             "maxStationaryStateIterations_ ( %lu ) must be less than maxIterations_ ( %lu )\n",
             in_RDI[1],*in_RDI);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  return;
}

Assistant:

EndCriteria::EndCriteria(size_t maxIterations,
                           size_t maxStationaryStateIterations,
                           RealType rootEpsilon, RealType functionEpsilon,
                           RealType gradientNormEpsilon) :
      maxIterations_(maxIterations),
      maxStationaryStateIterations_(maxStationaryStateIterations),
      rootEpsilon_(rootEpsilon), functionEpsilon_(functionEpsilon),
      gradientNormEpsilon_(gradientNormEpsilon) {
    // replaced the QL_REQUIRE macro with OpenMD's simError calls
    if (maxStationaryStateIterations_ <= 1) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "maxStationaryStateIterations_ ( %lu ) "
               "must be greater than one\n",
               (unsigned long)maxStationaryStateIterations_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
    if (maxStationaryStateIterations_ > maxIterations_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "maxStationaryStateIterations_ ( %lu ) "
               "must be less than maxIterations_ ( %lu )\n",
               (unsigned long)maxStationaryStateIterations_,
               (unsigned long)maxIterations_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
  }